

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O3

void __thiscall
QSslServerPrivate::handleHandshakeTimedOut(QSslServerPrivate *this,QSslSocket *socket)

{
  QObject *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined4 local_44;
  QSslSocket *local_40;
  void *local_38;
  QSslSocket **local_30;
  undefined4 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&(this->super_QTcpServerPrivate).field_0x8;
  removeSocketData(this,(quintptr)socket);
  (**(code **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket + 0x100))(socket);
  local_30 = &local_40;
  local_28 = &local_44;
  local_44 = 5;
  local_38 = (void *)0x0;
  local_40 = socket;
  QMetaObject::activate(this_00,&QSslServer::staticMetaObject,2,&local_38);
  QObject::deleteLater();
  cVar1 = (**(code **)(*(long *)(this->super_QTcpServerPrivate).socketEngine + 0x138))();
  if (cVar1 == '\0') {
    iVar2 = (**(code **)(*(long *)&this->super_QTcpServerPrivate + 0x28))(this);
    if (iVar2 < (this->super_QTcpServerPrivate).maxConnections) {
      QTcpServer::resumeAccepting((QTcpServer *)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::handleHandshakeTimedOut(QSslSocket *socket)
{
    Q_Q(QSslServer);
    removeSocketData(quintptr(socket));
    socket->disconnectFromHost();
    Q_EMIT q->errorOccurred(socket, QAbstractSocket::SocketTimeoutError);
    socket->deleteLater();
    if (!socketEngine->isReadNotificationEnabled() && totalPendingConnections() < maxConnections)
        q->resumeAccepting();
}